

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O0

real fasttext::distL2(real *x,real *y,int32_t d)

{
  undefined1 auVar1 [16];
  real tmp;
  int i;
  real dist;
  int32_t d_local;
  real *y_local;
  real *x_local;
  
  dist = 0.0;
  for (i = 0; i < d; i = i + 1) {
    auVar1 = vfmadd213ss_fma(ZEXT416((uint)(x[i] - y[i])),ZEXT416((uint)(x[i] - y[i])),
                             ZEXT416((uint)dist));
    dist = auVar1._0_4_;
  }
  return dist;
}

Assistant:

real distL2(const real* x, const real* y, int32_t d) {
  real dist = 0;
  for (auto i = 0; i < d; i++) {
    auto tmp = x[i] - y[i];
    dist += tmp * tmp;
  }
  return dist;
}